

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.h
# Opt level: O3

NLSolution * __thiscall
mp::NLSolver::Solve(NLSolution *__return_storage_ptr__,NLSolver *this,NLModel *mdl,string *solver,
                   string *solver_opts)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pdVar3;
  pointer pdVar4;
  double *x;
  double dVar5;
  bool bVar6;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  double local_98;
  pointer local_90;
  pointer pdStack_88;
  pointer local_80;
  pointer local_78;
  pointer pdStack_70;
  pointer local_68;
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  local_60;
  
  __return_storage_ptr__->solve_result_ = -2;
  __return_storage_ptr__->nbs_ = 0;
  (__return_storage_ptr__->solve_message_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->solve_message_).field_2;
  (__return_storage_ptr__->solve_message_)._M_string_length = 0;
  (__return_storage_ptr__->solve_message_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->suffixes_).
            super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t.
            _M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->suffixes_).
  super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->suffixes_).
  super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  __return_storage_ptr__->obj_val_ = 0.0;
  (__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->suffixes_).
  super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->suffixes_).
  super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->suffixes_).
  super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  bVar6 = LoadModel(this,mdl);
  if (bVar6) {
    bVar6 = Solve(this,solver,solver_opts);
    if (bVar6) {
      ReadSolution((NLSolution *)local_c0,this);
      __return_storage_ptr__->solve_result_ = local_c0._0_4_;
      __return_storage_ptr__->nbs_ = local_c0._4_4_;
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->solve_message_,(string *)&local_b8);
      __return_storage_ptr__->obj_val_ = local_98;
      pdVar3 = (__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = local_90;
      (__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdStack_88;
      (__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_80;
      local_90 = (pointer)0x0;
      pdStack_88 = (pointer)0x0;
      local_80 = (pointer)0x0;
      if (pdVar3 != (pointer)0x0) {
        operator_delete(pdVar3,(long)pdVar4 - (long)pdVar3);
      }
      pdVar3 = (__return_storage_ptr__->y_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (__return_storage_ptr__->y_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = local_78;
      (__return_storage_ptr__->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = pdStack_70;
      (__return_storage_ptr__->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_68;
      local_78 = (pointer)0x0;
      pdStack_70 = (pointer)0x0;
      local_68 = (pointer)0x0;
      if (pdVar3 != (pointer)0x0) {
        operator_delete(pdVar3,(long)pdVar4 - (long)pdVar3);
      }
      std::
      _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
      ::clear((_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
               *)&__return_storage_ptr__->suffixes_);
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var2 = &local_60._M_impl.super__Rb_tree_header;
        (__return_storage_ptr__->suffixes_).
        super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl
        .super__Rb_tree_header._M_header._M_color =
             local_60._M_impl.super__Rb_tree_header._M_header._M_color;
        (__return_storage_ptr__->suffixes_).
        super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl
        .super__Rb_tree_header._M_header._M_parent =
             local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        (__return_storage_ptr__->suffixes_).
        super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl
        .super__Rb_tree_header._M_header._M_left =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (__return_storage_ptr__->suffixes_).
        super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl
        .super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header
        ;
        (__return_storage_ptr__->suffixes_).
        super_set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>._M_t._M_impl
        .super__Rb_tree_header._M_node_count = local_60._M_impl.super__Rb_tree_header._M_node_count;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      }
      std::
      _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
      ::~_Rb_tree(&local_60);
      if (local_78 != (pointer)0x0) {
        operator_delete(local_78,(long)local_68 - (long)local_78);
      }
      if (local_90 != (pointer)0x0) {
        operator_delete(local_90,(long)local_80 - (long)local_90);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
      }
      x = (__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != x) {
        dVar5 = NLModel::ComputeObjValue(mdl,x);
        __return_storage_ptr__->obj_val_ = dVar5;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NLSolution Solve(const NLModel& mdl,
                   const std::string& solver,
                   const std::string& solver_opts) {
    NLSolution sol;
    if (LoadModel(mdl)
        && Solve(solver, solver_opts)) {
      sol = ReadSolution();
      if (sol.x_.size())
        sol.obj_val_ = mdl.ComputeObjValue(sol.x_.data());
    }
    return sol;
  }